

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::RenderInstanceShaders::addStage
          (RenderInstanceShaders *this,DeviceInterface *vki,VkDevice device,
          VkPhysicalDeviceFeatures *deviceFeatures,BinaryCollection *programCollection,char *name,
          VkShaderStageFlagBits stage,Move<vk::Handle<(vk::HandleType)14>_> *outModule)

{
  VkShaderStageFlagBits stage_00;
  char *this_00;
  VkPhysicalDeviceFeatures *device_00;
  VkDevice deviceInterface;
  bool bVar1;
  ProgramBinary *binary;
  Handle<(vk::HandleType)14> *pHVar2;
  NotSupportedError *this_01;
  char *pcVar3;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  deUint64 local_f0;
  VkPipelineShaderStageCreateInfo local_e8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  Move<vk::Handle<(vk::HandleType)14>_> module;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *name_local;
  BinaryCollection *programCollection_local;
  VkPhysicalDeviceFeatures *deviceFeatures_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  RenderInstanceShaders *this_local;
  
  local_38 = name;
  name_local = (char *)programCollection;
  programCollection_local = (BinaryCollection *)deviceFeatures;
  deviceFeatures_local = (VkPhysicalDeviceFeatures *)device;
  device_local = (VkDevice)vki;
  vki_local = (DeviceInterface *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  bVar1 = ::vk::ProgramCollection<vk::ProgramBinary>::contains(programCollection,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar1) {
    bVar1 = ::vk::isShaderStageSupported((VkPhysicalDeviceFeatures *)programCollection_local,stage);
    deviceInterface = device_local;
    device_00 = deviceFeatures_local;
    this_00 = name_local;
    pcVar3 = local_38;
    if (!bVar1) {
      (**(code **)(*(long *)device_local + 0x20))(device_local,deviceFeatures_local);
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<vk::VkShaderStageFlagBits>(&local_130,&stage);
      std::operator+(&local_110,&local_130," is not supported");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      tcu::NotSupportedError::NotSupportedError
                (this_01,pcVar3,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar3,&local_b1);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       ((ProgramCollection<vk::ProgramBinary> *)this_00,&local_b0);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)local_90,(DeviceInterface *)deviceInterface,
               (VkDevice)device_00,binary,0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    stage_00 = stage;
    pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_90);
    local_f0 = pHVar2->m_internal;
    getShaderStageCreateInfo(&local_e8,this,stage_00,(VkShaderModule)local_f0);
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
    ::push_back(&this->m_stageInfos,&local_e8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (outModule,(Move<vk::Handle<(vk::HandleType)14>_> *)local_90);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)14>_> *)local_90);
  }
  return;
}

Assistant:

void RenderInstanceShaders::addStage (const vk::DeviceInterface&			vki,
									  vk::VkDevice							device,
									  const vk::VkPhysicalDeviceFeatures&	deviceFeatures,
									  const vk::BinaryCollection&			programCollection,
									  const char*							name,
									  vk::VkShaderStageFlagBits				stage,
									  vk::Move<vk::VkShaderModule>*			outModule)
{
	if (programCollection.contains(name))
	{
		if (vk::isShaderStageSupported(deviceFeatures, stage))
		{
			vk::Move<vk::VkShaderModule>	module	= createShaderModule(vki, device, programCollection.get(name), (vk::VkShaderModuleCreateFlags)0);

			m_stageInfos.push_back(getShaderStageCreateInfo(stage, *module));
			*outModule = module;
		}
		else
		{
			// Wait for the GPU to idle so that throwing the exception
			// below doesn't free in-use GPU resource.
			vki.deviceWaitIdle(device);
			TCU_THROW(NotSupportedError, (de::toString(stage) + " is not supported").c_str());
		}
	}
}